

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile(DescriptorTable *table)

{
  bool bVar1;
  GeneratedMessageFactory *pGVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  DescriptorTable *local_48;
  LogMessage local_40;
  
  pGVar2 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_48 = table;
  bVar1 = InsertIfNotPresent<std::unordered_map<char_const*,google::protobuf::internal::DescriptorTable_const*,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>>>>
                    (&pGVar2->file_map_,&table->filename,&local_48);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x247);
    pLVar3 = internal::LogMessage::operator<<(&local_40,"File is already registered: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_48->filename);
    internal::LogFinisher::operator=(&local_49,pLVar3);
    internal::LogMessage::~LogMessage(&local_40);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const google::protobuf::internal::DescriptorTable* table) {
  GeneratedMessageFactory::singleton()->RegisterFile(table);
}